

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_engine.cpp
# Opt level: O0

void __thiscall zmq::raw_engine_t::error(raw_engine_t *this,error_reason_t reason_)

{
  long *plVar1;
  undefined4 uVar2;
  int __fd;
  EVP_PKEY_CTX *in_RSI;
  long in_RDI;
  msg_t terminator;
  code *local_70;
  undefined1 local_50 [60];
  undefined4 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar2 = SUB84(in_RSI,0);
  if (((*(byte *)(in_RDI + 0x18b) & 1) != 0) && ((*(byte *)(in_RDI + 0x18c) & 1) != 0)) {
    msg_t::init((msg_t *)local_50,in_RSI);
    local_70 = *(code **)(in_RDI + 0x558);
    plVar1 = (long *)(in_RDI + *(long *)(in_RDI + 0x560));
    if (((ulong)local_70 & 1) != 0) {
      local_70 = *(code **)(local_70 + *plVar1 + -1);
    }
    __fd = (int)local_50;
    (*local_70)(plVar1);
    msg_t::close((msg_t *)local_50,__fd);
  }
  stream_engine_base_t::error
            ((stream_engine_base_t *)CONCAT44(uVar2,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffec);
  return;
}

Assistant:

void zmq::raw_engine_t::error (error_reason_t reason_)
{
    if (_options.raw_socket && _options.raw_notify) {
        //  For raw sockets, send a final 0-length message to the application
        //  so that it knows the peer has been disconnected.
        msg_t terminator;
        terminator.init ();
        (this->*_process_msg) (&terminator);
        terminator.close ();
    }
    stream_engine_base_t::error (reason_);
}